

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkFrameExtend(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  int nPosOld;
  int nPisOld;
  int iStartPo;
  int k;
  int i;
  Abc_Obj_t *pMux;
  Abc_Obj_t *pAnd1;
  Abc_Obj_t *pAnd0;
  Abc_Obj_t *pEnableN;
  Abc_Obj_t *pResetN;
  Abc_Obj_t *pSignal;
  Abc_Obj_t *pEnable;
  Abc_Obj_t *pReset;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vFanins;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPiNum(pNtk);
  iVar2 = Abc_NtkPoNum(pNtk);
  if (pNtk->nConstrs != 0) {
    iVar3 = Abc_NtkPiNum(pNtk);
    if (iVar3 < pNtk->nConstrs) {
      __assert_fail("Abc_NtkPiNum(pNtk) >= pNtk->nConstrs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                    ,0x111,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
    }
    iVar3 = Abc_NtkPoNum(pNtk);
    if (iVar3 < pNtk->nConstrs * 4) {
      __assert_fail("Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                    ,0x112,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
    }
    iVar3 = Abc_NtkNodeNum(pNtk);
    p = Vec_PtrAlloc(iVar3);
    for (iStartPo = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), iStartPo < iVar3; iStartPo = iStartPo + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,iStartPo);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) {
        Vec_PtrPush(p,pAVar4);
      }
    }
    p_00 = Vec_PtrAlloc(2);
    for (iStartPo = 0;
        (iVar3 = Abc_NtkPiNum(pNtk), iStartPo < iVar3 &&
        (pAVar4 = Abc_NtkPi(pNtk,iStartPo), iStartPo != iVar1)); iStartPo = iStartPo + 1) {
      if (iStartPo < iVar1 - pNtk->nConstrs) {
        Abc_NtkDupObj(pNtk,pAVar4,0);
        pAVar8 = (pAVar4->field_6).pCopy;
        pcVar7 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar8,pcVar7,"_frame1");
      }
      else {
        iVar3 = iVar2 + (iStartPo - iVar1) * 4;
        pAVar8 = Abc_NtkPo(pNtk,iVar3 + 1);
        pAVar8 = Abc_ObjFanin0(pAVar8);
        pAVar9 = Abc_NtkPo(pNtk,iVar3 + 2);
        pAVar9 = Abc_ObjFanin0(pAVar9);
        pAVar5 = Abc_NtkPo(pNtk,iVar3 + 3);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        pAVar8 = Abc_NtkCreateNodeInv(pNtk,pAVar8);
        pAVar6 = Abc_NtkCreateNodeInv(pNtk,pAVar9);
        Vec_PtrFillTwo(p_00,2,pAVar6,pAVar4);
        pAVar6 = Abc_NtkCreateNodeAnd(pNtk,p_00);
        Vec_PtrFillTwo(p_00,2,pAVar9,pAVar5);
        pAVar9 = Abc_NtkCreateNodeAnd(pNtk,p_00);
        Vec_PtrFillTwo(p_00,2,pAVar6,pAVar9);
        pAVar9 = Abc_NtkCreateNodeOr(pNtk,p_00);
        Vec_PtrFillTwo(p_00,2,pAVar8,pAVar9);
        pAVar8 = Abc_NtkCreateNodeAnd(pNtk,p_00);
        (pAVar4->field_6).pCopy = pAVar8;
      }
    }
    for (iStartPo = 0; iVar1 = Vec_PtrSize(p), iStartPo < iVar1; iStartPo = iStartPo + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iStartPo);
      Abc_NtkDupObj(pNtk,pAVar4,0);
    }
    for (iStartPo = 0; iVar1 = Vec_PtrSize(p), iStartPo < iVar1; iStartPo = iStartPo + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iStartPo);
      for (nPisOld = 0; iVar1 = Abc_ObjFaninNum(pAVar4), nPisOld < iVar1; nPisOld = nPisOld + 1) {
        pAVar8 = Abc_ObjFanin(pAVar4,nPisOld);
        Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar8->field_6).pCopy);
      }
    }
    for (iStartPo = 0;
        (iVar1 = Abc_NtkPoNum(pNtk), iStartPo < iVar1 &&
        (pAVar4 = Abc_NtkPo(pNtk,iStartPo), iStartPo != iVar2)); iStartPo = iStartPo + 1) {
      if (iStartPo < iVar2 + pNtk->nConstrs * -4) {
        Abc_NtkDupObj(pNtk,pAVar4,0);
        pAVar8 = (pAVar4->field_6).pCopy;
        pcVar7 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar8,pcVar7,"_frame1");
        pAVar8 = (pAVar4->field_6).pCopy;
        pAVar4 = Abc_ObjFanin0(pAVar4);
        Abc_ObjAddFanin(pAVar8,(pAVar4->field_6).pCopy);
      }
      else {
        pAVar8 = Abc_ObjFanin0(pAVar4);
        pAVar9 = Abc_ObjFanin0(pAVar4);
        Abc_ObjPatchFanin(pAVar4,pAVar8,(pAVar9->field_6).pCopy);
      }
    }
    Vec_PtrFree(p_00);
    Vec_PtrFree(p);
  }
  return;
}

Assistant:

void Abc_NtkFrameExtend( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vFanins, * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pReset, * pEnable, * pSignal;
    Abc_Obj_t * pResetN, * pEnableN, * pAnd0, * pAnd1, * pMux;
    int i, k, iStartPo, nPisOld = Abc_NtkPiNum(pNtk), nPosOld = Abc_NtkPoNum(pNtk);
    // skip if there are no flops
    if ( pNtk->nConstrs == 0 )
        return;
    assert( Abc_NtkPiNum(pNtk) >= pNtk->nConstrs );
    assert( Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4 );
    // collect nodes
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vNodes, pObj );
    // duplicate PIs
    vFanins = Vec_PtrAlloc( 2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( i == nPisOld )
            break;
        if ( i < nPisOld - pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            continue;
        }
        // create flop input
        iStartPo = nPosOld + 4 * (i - nPisOld);
        pReset   = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 1 ) );
        pEnable  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 2 ) );
        pSignal  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 3 ) );
        pResetN  = Abc_NtkCreateNodeInv( pNtk, pReset );
        pEnableN = Abc_NtkCreateNodeInv( pNtk, pEnable );
        Vec_PtrFillTwo( vFanins, 2, pEnableN, pObj );
        pAnd0    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pEnable, pSignal );
        pAnd1    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pAnd0, pAnd1 );
        pMux     = Abc_NtkCreateNodeOr( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pResetN, pMux );
        pObj->pCopy = Abc_NtkCreateNodeAnd( pNtk, vFanins );
    }
    // duplicate internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtk, pObj, 0 );
    // connect objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // create new POs and reconnect flop inputs
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i == nPosOld )
            break;
        if ( i < nPosOld - 4 * pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
            continue;
        }
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), Abc_ObjFanin0(pObj)->pCopy );
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vNodes );
}